

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O1

Integer has_negative_elem(Integer g_a,Integer *alo,Integer *ahi)

{
  char *pcVar1;
  int iVar2;
  logical lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Integer IVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  char *A_ptr;
  Integer andim;
  Integer atype;
  Integer loA [7];
  Integer hiA [7];
  Integer ldA [7];
  Integer bunit [7];
  Integer loS [7];
  Integer adims [7];
  _iterator_hdl hdl;
  char *local_558;
  long local_550;
  long local_548;
  Integer *local_540;
  Integer *local_538;
  long local_530 [8];
  long alStack_4f0 [9];
  long local_4a8 [8];
  undefined8 local_468;
  long lStack_460;
  undefined1 local_458 [48];
  long local_428 [8];
  long local_3e8 [7];
  long alStack_3b0 [9];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  pnga_nodeid();
  pnga_sync();
  pnga_check_handle(g_a,"has_negative_elem");
  pnga_inquire(g_a,&local_548,&local_550,local_368);
  pnga_total_blocks(g_a);
  if (0 < local_550) {
    lVar8 = 0;
    do {
      if ((alo[lVar8] < 1) || (local_368[lVar8] < ahi[lVar8])) {
        pnga_error("g_a indices out of range ",g_a);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_550);
  }
  pnga_local_iterator_init(g_a,&local_330);
  iVar2 = pnga_local_iterator_next(&local_330,local_530 + 1,alStack_4f0 + 1,&local_558,local_4a8);
  if (iVar2 == 0) {
    IVar9 = 0;
  }
  else {
    IVar9 = 0;
    local_540 = ahi;
    local_538 = alo;
    do {
      lVar8 = local_550;
      if (0 < local_550) {
        memcpy(alStack_3b0 + 1,local_530 + 1,local_550 * 8);
      }
      lVar3 = pnga_patch_intersect(local_538,ahi,local_530 + 1,alStack_4f0 + 1,lVar8);
      if (lVar3 != 0) {
        if (0 < local_550) {
          lVar8 = 0;
LAB_00121f16:
          if (local_530[lVar8 + 1] <= alStack_3b0[lVar8 + 1]) goto code_r0x00121f25;
          if (local_550 == 1) {
            lVar8 = 1;
            lVar10 = 0;
          }
          else {
            lVar8 = 1;
            lVar12 = 0;
            lVar10 = 0;
            do {
              lVar10 = lVar10 + (local_530[lVar12 + 1] - alStack_3b0[lVar12 + 1]) * lVar8;
              lVar8 = lVar8 * local_4a8[lVar12];
              lVar12 = lVar12 + 1;
            } while (local_550 + -1 != lVar12);
          }
          if (local_548 - 0x3e9U < 7) {
            lVar10 = (local_530[local_550] - alStack_3b0[local_550]) * lVar8 + lVar10;
            switch(local_548) {
            case 0x3e9:
            case 0x3eb:
              lVar10 = lVar10 * 4;
              break;
            default:
              lVar10 = lVar10 * 8;
              break;
            case 0x3ed:
              goto switchD_00121fab_caseD_3ed;
            case 0x3ef:
              lVar10 = lVar10 * 0x10;
            }
            local_558 = local_558 + lVar10;
          }
          else {
switchD_00121fab_caseD_3ed:
            pnga_error(" wrong data type ",local_548);
          }
        }
LAB_00121fc1:
        lVar10 = local_548;
        lVar8 = local_550;
        pcVar1 = local_558;
        lVar12 = 1;
        if (1 < local_550) {
          lVar4 = 1;
          do {
            lVar12 = lVar12 * ((alStack_4f0[lVar4 + 1] - local_530[lVar4 + 1]) + 1);
            lVar4 = lVar4 + 1;
          } while (local_550 != lVar4);
        }
        local_468 = 0;
        lStack_460 = 0;
        local_3e8[0] = 1;
        local_3e8[1] = 1;
        local_428[0] = local_4a8[0];
        local_428[1] = local_4a8[0] * local_4a8[1];
        if (2 < local_550) {
          memset(local_458,0,local_550 * 8 - 0x10);
          lVar5 = 2;
          lVar4 = local_428[1];
          lVar6 = local_3e8[1];
          do {
            lVar6 = lVar6 * ((alStack_4f0[lVar5] - local_530[lVar5]) + 1);
            lVar4 = lVar4 * local_4a8[lVar5];
            local_3e8[lVar5] = lVar6;
            local_428[lVar5] = lVar4;
            lVar5 = lVar5 + 1;
          } while (lVar8 != lVar5);
        }
        if (lVar12 < 1) {
          IVar9 = 0;
          ahi = local_540;
        }
        else {
          lVar4 = lVar8 + -1;
          IVar9 = 0;
          lVar6 = 0;
          local_530[0] = lVar8;
          do {
            if (lVar8 < 2) {
              lVar5 = 0;
            }
            else {
              lVar11 = 0;
              lVar5 = 0;
              do {
                lVar7 = *(long *)(local_458 + lVar11 * 8 + -8);
                if ((lVar6 + 1) % local_3e8[lVar11 + 1] == 0) {
                  *(long *)(local_458 + lVar11 * 8 + -8) = lVar7 + 1;
                }
                lVar5 = lVar5 + lVar7 * local_428[lVar11];
                lVar7 = 0;
                if (*(long *)(local_458 + lVar11 * 8 + -8) <=
                    alStack_4f0[lVar11 + 2] - local_530[lVar11 + 2]) {
                  lVar7 = *(long *)(local_458 + lVar11 * 8 + -8);
                }
                *(long *)(local_458 + lVar11 * 8 + -8) = lVar7;
                lVar11 = lVar11 + 1;
              } while (lVar4 != lVar11);
            }
            switch(lVar10) {
            case 0x3e9:
              lVar11 = alStack_4f0[1] - local_530[1];
              if (local_530[1] <= alStack_4f0[1]) {
                if (lVar11 < 1) {
                  lVar11 = 0;
                }
                lVar7 = 0;
                do {
                  if (*(int *)(pcVar1 + lVar7 * 4 + lVar5 * 4) < 0) {
                    IVar9 = 1;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar11 + 1 != lVar7);
              }
              break;
            case 0x3ea:
              lVar11 = alStack_4f0[1] - local_530[1];
              if (local_530[1] <= alStack_4f0[1]) {
                if (lVar11 < 1) {
                  lVar11 = 0;
                }
                lVar7 = 0;
                do {
                  if (*(long *)(pcVar1 + lVar7 * 8 + lVar5 * 8) < 0) {
                    IVar9 = 1;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar11 + 1 != lVar7);
              }
              break;
            case 0x3eb:
              lVar11 = alStack_4f0[1] - local_530[1];
              if (local_530[1] <= alStack_4f0[1]) {
                if (lVar11 < 1) {
                  lVar11 = 0;
                }
                lVar7 = 0;
                do {
                  if (*(float *)(pcVar1 + lVar7 * 4 + lVar5 * 4) <= 0.0 &&
                      *(float *)(pcVar1 + lVar7 * 4 + lVar5 * 4) != 0.0) {
                    IVar9 = 1;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar11 + 1 != lVar7);
              }
              break;
            case 0x3ec:
              lVar11 = alStack_4f0[1] - local_530[1];
              if (local_530[1] <= alStack_4f0[1]) {
                if (lVar11 < 1) {
                  lVar11 = 0;
                }
                lVar7 = 0;
                do {
                  if (*(double *)(pcVar1 + lVar7 * 8 + lVar5 * 8) <= 0.0 &&
                      *(double *)(pcVar1 + lVar7 * 8 + lVar5 * 8) != 0.0) {
                    IVar9 = 1;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar11 + 1 != lVar7);
              }
              break;
            default:
              pnga_error(" has_negative_elem: wrong data type ",lVar10);
              lVar8 = local_530[0];
            }
            lVar6 = lVar6 + 1;
            ahi = local_540;
          } while (lVar6 != lVar12);
        }
      }
      iVar2 = pnga_local_iterator_next
                        (&local_330,local_530 + 1,alStack_4f0 + 1,&local_558,local_4a8);
    } while (iVar2 != 0);
  }
  pnga_sync();
  return IVar9;
code_r0x00121f25:
  lVar8 = lVar8 + 1;
  if (local_550 == lVar8) goto LAB_00121fc1;
  goto LAB_00121f16;
}

Assistant:

static Integer has_negative_elem(g_a, alo, ahi)
Integer g_a, *alo, *ahi;    /* patch of g_a */
/*returned value: 1=found; 0 = not found*/
{
  Integer i;
  Integer atype;
  Integer andim, adims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  char *A_ptr; 
  Integer iretval = 0;
  Integer num_blocks;
  Integer me= pnga_nodeid();
  _iterator_hdl hdl;


  pnga_sync();
  pnga_check_handle(g_a, "has_negative_elem");

  pnga_inquire(g_a, &atype, &andim, adims);
  num_blocks = pnga_total_blocks(g_a);

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl, loA, hiA, &A_ptr, ldA)) {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];
    /* loA is changed by pnga_patch_intersect, so
     *            save a copy */
    for (j=0; j<andim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){

      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<andim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<andim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ldA[j];
        }
        offset += (loA[andim-1]-loS[andim-1])*jtmp;
        switch (atype){
          case C_INT:
            A_ptr = (void*)((int*)A_ptr + offset);
            break;
          case C_DCPL:
            A_ptr = (void*)((double*)A_ptr + 2*offset);
            break;
          case C_SCPL:
            A_ptr = (void*)((float*)A_ptr + 2*offset);
            break;
          case C_DBL:
            A_ptr = (void*)((double*)A_ptr + offset);
            break;
          case C_FLOAT:
            A_ptr = (void*)((float*)A_ptr + offset);
            break;
          case C_LONG:
            A_ptr = (void*)((long*)A_ptr + offset);
            break;
          default: pnga_error(" wrong data type ",atype);
        }
      }

      /* check all values in patch */
      ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);
    }
  }
#else
  if (num_blocks < 0) {
    /* find out coordinates of patches of g_a, g_b and g_c that I own */
    pnga_distribution(g_a, me, loA, hiA);
    iretval = 0;
    /*  determine subsets of my patches to access  */
    if (pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
      pnga_access_ptr(g_a, loA, hiA, &A_ptr, ldA);

      ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);

      /* release access to the data */
      pnga_release (g_a, loA, hiA);
    }
  } else {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM], nproc;
    nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {
        /* get limits of patch */
        pnga_distribution(g_a, i, loA, hiA);

        /* loA is changed by pnga_patch_intersect, so
         *            save a copy */
        for (j=0; j<andim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &A_ptr, ldA);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<andim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<andim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ldA[j];
            }
            offset += (loA[andim-1]-loS[andim-1])*jtmp;
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)A_ptr + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((double*)A_ptr + 2*offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((float*)A_ptr + 2*offset);
                break;
              case C_DBL:
                A_ptr = (void*)((double*)A_ptr + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)A_ptr + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)A_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",atype);
            }
          }

          /* check all values in patch */
          ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
        }
        /* loA is changed by pnga_patch_intersect, so
         *            save a copy */
        for (j=0; j<andim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &A_ptr, ldA);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<andim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<andim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ldA[j];
            }
            offset += (loA[andim-1]-loS[andim-1])*jtmp;
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)A_ptr + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((double*)A_ptr + 2*offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((float*)A_ptr + 2*offset);
                break;
              case C_DBL:
                A_ptr = (void*)((double*)A_ptr + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)A_ptr + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)A_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",atype);
            }
          }

          /* check all values in patch */
          ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }

        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  pnga_sync();
  return iretval; /*negative element is not found in g_a*/
}